

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pystring.cpp
# Opt level: O2

string * pystring::mul(string *__return_storage_ptr__,string *str,int n)

{
  undefined1 *puVar1;
  bool bVar2;
  ostringstream os;
  ostringstream aoStack_198 [376];
  
  if (n < 1) {
    puVar1 = empty_string_abi_cxx11_;
  }
  else {
    puVar1 = (undefined1 *)str;
    if (n != 1) {
      std::__cxx11::ostringstream::ostringstream(aoStack_198);
      while (bVar2 = n != 0, n = n + -1, bVar2) {
        std::operator<<((ostream *)aoStack_198,(string *)str);
      }
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream(aoStack_198);
      return __return_storage_ptr__;
    }
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)puVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string mul( const std::string & str, int n )
    {
        // Early exits
        if (n <= 0) return empty_string;
        if (n == 1) return str;
        
        std::ostringstream os;
        for(int i=0; i<n; ++i)
        {
            os << str;
        }
        return os.str();
    }